

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_getDiceRoller(bool verbose)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries;
  Hand *this;
  DiceRoller *this_00;
  Player *this_01;
  ostream *poVar1;
  bool bVar2;
  _Vector_base<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> rolls;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  
  ownedCountries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (Hand *)operator_new(8);
  Hand::Hand(this);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,ownedCountries,this,this_00,1);
  DiceRoller::roll(&rolls,this_01->pDiceRoller,1);
  if (rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    bVar2 = false;
  }
  else {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&local_c0,this_01->pDiceRoller,2);
    if ((long)local_c0._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c0._M_impl.super__Vector_impl_data._M_start == 8) {
      DiceRoller::getHistory((vector<int,_std::allocator<int>_> *)&local_90,this_01->pDiceRoller);
      if (local_90._M_impl.super__Vector_impl_data._M_start ==
          local_90._M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = false;
      }
      else {
        DiceRoller::getPercentages
                  ((vector<double,_std::allocator<double>_> *)&local_78,this_01->pDiceRoller);
        bVar2 = local_78._M_impl.super__Vector_impl_data._M_start !=
                local_78._M_impl.super__Vector_impl_data._M_finish;
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
    }
    else {
      bVar2 = false;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c0);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&rolls.super__Vector_base<int,_std::allocator<int>_>);
  if (verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<(poVar1,"\x1b[35m");
    std::operator<<((ostream *)&std::cout,"player1 rolled ");
    DiceRoller::roll(&rolls,this_01->pDiceRoller,1);
    local_40 = &std::cout;
    local_38 = 0;
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)&local_c0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(ostream_iterator<int,_char,_std::char_traits<char>_> *)
                        rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"player1 rolled ");
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&local_c0,this_01->pDiceRoller,2);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&rolls,&local_c0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c0);
    local_50 = &std::cout;
    local_48 = 0;
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)&local_c0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(ostream_iterator<int,_char,_std::char_traits<char>_> *)
                        rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"player1 rolled ");
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&local_c0,this_01->pDiceRoller,3);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&rolls,&local_c0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c0);
    local_60 = &std::cout;
    local_58 = 0;
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)&local_c0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(ostream_iterator<int,_char,_std::char_traits<char>_> *)
                        rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    std::operator<<((ostream *)&std::cout,"\x1b[31m\n");
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&rolls.super__Vector_base<int,_std::allocator<int>_>);
  }
  Player::~Player(this_01);
  operator_delete(this_01,0x38);
  return bVar2;
}

Assistant:

bool test_Player_getDiceRoller(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    auto* cards = new Hand();
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 1);

    // Assert
    if (player1->getDiceRoller()->roll(1).empty()
        || player1->getDiceRoller()->roll(2).size() != 2
        || player1->getDiceRoller()->getHistory().empty()
        || player1->getDiceRoller()->getPercentages().empty()) {

        success = false;
    }

    if (verbose) {
        std::cout << "\n" << "\033[35m";
        std::cout << "player1 rolled ";
        std::vector<int> rolls = player1->getDiceRoller()->roll(1);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << std::endl;
        std::cout << "player1 rolled ";
        rolls = player1->getDiceRoller()->roll(2);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << std::endl;
        std::cout << "player1 rolled ";
        rolls = player1->getDiceRoller()->roll(3);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << "\033[31m\n";
    }
    delete player1;
    return success;
}